

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_postfork_child(tsdn_t *tsdn,arena_t *arena)

{
  tcache_t *ptVar1;
  cache_bin_array_descriptor_t *pcVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  arena->nthreads[0].repr = 0;
  arena->nthreads[1].repr = 0;
  if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena == arena) {
    LOCK();
    arena->nthreads[0].repr = arena->nthreads[0].repr + 1;
    UNLOCK();
  }
  if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_iarena == arena) {
    LOCK();
    arena->nthreads[1].repr = arena->nthreads[1].repr + 1;
    UNLOCK();
  }
  (arena->tcache_ql).qlh_first = (tcache_t *)0x0;
  (arena->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
  if (((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.arena == arena)) {
    ptVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.link.qre_next = ptVar1;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.link.qre_prev = ptVar1;
    (arena->tcache_ql).qlh_first = ptVar1;
    pcVar2 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.
              cache_bin_array_descriptor;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.
    cache_bin_array_descriptor.link.qre_next = pcVar2;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.
    cache_bin_array_descriptor.link.qre_prev = pcVar2;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.
    cache_bin_array_descriptor.bins_small =
         (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_small;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.
    cache_bin_array_descriptor.bins_large =
         (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large;
    (arena->cache_bin_array_descriptor_ql).qlh_first = pcVar2;
  }
  lVar5 = 0;
  do {
    if (bin_infos[lVar5].n_shards != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        bin_postfork_child(tsdn,(bin_t *)((long)&((arena->bins[lVar5].bin_shards)->lock).field_0 +
                                         lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x118;
      } while (uVar4 < bin_infos[lVar5].n_shards);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x24);
  malloc_mutex_postfork_child(tsdn,&arena->large_mtx);
  base_postfork_child(tsdn,arena->base);
  malloc_mutex_postfork_child(tsdn,&arena->extent_avail_mtx);
  extents_postfork_child(tsdn,&arena->extents_dirty);
  extents_postfork_child(tsdn,&arena->extents_muzzy);
  extents_postfork_child(tsdn,&arena->extents_retained);
  malloc_mutex_postfork_child(tsdn,&arena->extent_grow_mtx);
  malloc_mutex_postfork_child(tsdn,&(arena->decay_dirty).mtx);
  malloc_mutex_postfork_child(tsdn,&(arena->decay_muzzy).mtx);
  malloc_mutex_postfork_child(tsdn,&arena->tcache_ql_mtx);
  return;
}

Assistant:

void
arena_postfork_child(tsdn_t *tsdn, arena_t *arena) {
	unsigned i;

	atomic_store_u(&arena->nthreads[0], 0, ATOMIC_RELAXED);
	atomic_store_u(&arena->nthreads[1], 0, ATOMIC_RELAXED);
	if (tsd_arena_get(tsdn_tsd(tsdn)) == arena) {
		arena_nthreads_inc(arena, false);
	}
	if (tsd_iarena_get(tsdn_tsd(tsdn)) == arena) {
		arena_nthreads_inc(arena, true);
	}
	if (config_stats) {
		ql_new(&arena->tcache_ql);
		ql_new(&arena->cache_bin_array_descriptor_ql);
		tcache_t *tcache = tcache_get(tsdn_tsd(tsdn));
		if (tcache != NULL && tcache->arena == arena) {
			ql_elm_new(tcache, link);
			ql_tail_insert(&arena->tcache_ql, tcache, link);
			cache_bin_array_descriptor_init(
			    &tcache->cache_bin_array_descriptor,
			    tcache->bins_small, tcache->bins_large);
			ql_tail_insert(&arena->cache_bin_array_descriptor_ql,
			    &tcache->cache_bin_array_descriptor, link);
		}
	}

	for (i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_postfork_child(tsdn, &arena->bins[i].bin_shards[j]);
		}
	}
	malloc_mutex_postfork_child(tsdn, &arena->large_mtx);
	base_postfork_child(tsdn, arena->base);
	malloc_mutex_postfork_child(tsdn, &arena->extent_avail_mtx);
	extents_postfork_child(tsdn, &arena->extents_dirty);
	extents_postfork_child(tsdn, &arena->extents_muzzy);
	extents_postfork_child(tsdn, &arena->extents_retained);
	malloc_mutex_postfork_child(tsdn, &arena->extent_grow_mtx);
	malloc_mutex_postfork_child(tsdn, &arena->decay_dirty.mtx);
	malloc_mutex_postfork_child(tsdn, &arena->decay_muzzy.mtx);
	if (config_stats) {
		malloc_mutex_postfork_child(tsdn, &arena->tcache_ql_mtx);
	}
}